

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teststreamclient.cpp
# Opt level: O1

void __thiscall test_timeInfo::test_method(test_timeInfo *this)

{
  uint32_t uVar1;
  Value *pVVar2;
  uint64_t uVar3;
  Value params;
  timeInfo timeInfo;
  undefined1 local_1c8 [8];
  undefined8 local_1c0;
  shared_count sStack_1b8;
  Value local_1b0;
  char *local_188;
  char *local_180;
  timeInfo local_178;
  Value local_160;
  Value local_138;
  Value local_110;
  Value local_e8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  hbm::streaming::timeInfo::timeInfo(&local_178);
  Json::Value::Value(&local_1b0,nullValue);
  Json::Value::Value(&local_e8,"ntp");
  pVVar2 = Json::Value::operator[](&local_1b0,"stamp");
  pVVar2 = Json::Value::operator[](pVVar2,"type");
  Json::Value::operator=(pVVar2,&local_e8);
  Json::Value::~Value(&local_e8);
  Json::Value::Value(&local_110,8);
  pVVar2 = Json::Value::operator[](&local_1b0,"stamp");
  pVVar2 = Json::Value::operator[](pVVar2,"seconds");
  Json::Value::operator=(pVVar2,&local_110);
  Json::Value::~Value(&local_110);
  hbm::streaming::timeInfo::set(&local_178,&local_1b0);
  Json::Value::~Value(&local_1b0);
  uVar3 = hbm::streaming::timeInfo::ntpTimeStamp(&local_178);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/test/teststreamclient.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x31);
  local_1c8[0] = uVar3 == 0x800000000;
  local_1c0 = 0;
  sStack_1b8.pi_ = (sp_counted_base *)0x0;
  local_188 = "timestamp==0x0800000000";
  local_180 = "";
  local_1b0._8_1_ = 0;
  local_1b0.value_.real_ = (double)&PTR__lazy_ostream_0011fa90;
  local_1b0.comments_ = (CommentInfo *)&boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/test/teststreamclient.cpp"
  ;
  local_58 = "";
  local_1b0.start_ = (size_t)&local_188;
  boost::test_tools::tt_detail::report_assertion(local_1c8,&local_1b0,&local_60,0x31,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_1b8);
  hbm::streaming::timeInfo::clear(&local_178);
  uVar3 = hbm::streaming::timeInfo::ntpTimeStamp(&local_178);
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/test/teststreamclient.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x35);
  local_1c8[0] = uVar3 == 0;
  local_1c0 = 0;
  sStack_1b8.pi_ = (sp_counted_base *)0x0;
  local_188 = "timestamp==0";
  local_180 = "";
  local_1b0._8_1_ = 0;
  local_1b0.value_.real_ = (double)&PTR__lazy_ostream_0011fa90;
  local_1b0.comments_ = (CommentInfo *)&boost::unit_test::lazy_ostream::inst;
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/test/teststreamclient.cpp"
  ;
  local_88 = "";
  local_1b0.start_ = (size_t)&local_188;
  boost::test_tools::tt_detail::report_assertion(local_1c8,&local_1b0,&local_90,0x35,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_1b8);
  Json::Value::Value(&local_1b0,nullValue);
  Json::Value::Value(&local_138,"ntp");
  pVVar2 = Json::Value::operator[](&local_1b0,"stamp");
  pVVar2 = Json::Value::operator[](pVVar2,"type");
  Json::Value::operator=(pVVar2,&local_138);
  Json::Value::~Value(&local_138);
  Json::Value::Value(&local_160,3);
  pVVar2 = Json::Value::operator[](&local_1b0,"stamp");
  pVVar2 = Json::Value::operator[](pVVar2,"era");
  Json::Value::operator=(pVVar2,&local_160);
  Json::Value::~Value(&local_160);
  hbm::streaming::timeInfo::set(&local_178,&local_1b0);
  Json::Value::~Value(&local_1b0);
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/test/teststreamclient.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x3f);
  uVar1 = hbm::streaming::timeInfo::era(&local_178);
  local_1c8[0] = uVar1 == 3;
  local_1c0 = 0;
  sStack_1b8.pi_ = (sp_counted_base *)0x0;
  local_188 = "timeInfo.era()==3";
  local_180 = "";
  local_1b0._8_1_ = 0;
  local_1b0.value_.real_ = (double)&PTR__lazy_ostream_0011fa90;
  local_1b0.comments_ = (CommentInfo *)&boost::unit_test::lazy_ostream::inst;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/test/teststreamclient.cpp"
  ;
  local_b8 = "";
  local_1b0.start_ = (size_t)&local_188;
  boost::test_tools::tt_detail::report_assertion(local_1c8,&local_1b0,&local_c0,0x3f,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_1b8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE (test_timeInfo)
{
//	}
//		”params”: {
//			"type": "ntp",
//			"era": <number>,
//			"seconds": <number>,
//			"fraction": <number>,
//			"subFraction": <number>
//		}
//	}


	hbm::streaming::timeInfo timeInfo;
	uint64_t timestamp;

	{
		Json::Value params;

		params["stamp"]["type"] = "ntp";
		params["stamp"]["seconds"] = 8;

		timeInfo.set(params);
	}
	timestamp = timeInfo.ntpTimeStamp();
	BOOST_CHECK(timestamp==0x0800000000);

	timeInfo.clear();
	timestamp = timeInfo.ntpTimeStamp();
	BOOST_CHECK(timestamp==0);

	{
		Json::Value params;

		params["stamp"]["type"] = "ntp";
		params["stamp"]["era"] = 3;

		timeInfo.set(params);
	}
	BOOST_CHECK(timeInfo.era()==3);
}